

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Response *
kj::_::convertToReturn<kj::HttpInputStream::Response>
          (Response *__return_storage_ptr__,ExceptionOr<kj::HttpInputStream::Response> *result)

{
  Response *pRVar1;
  Exception *pEVar2;
  Exception *exception_1;
  Exception *_exception92;
  Exception *exception;
  Exception *_exception88;
  Response *value;
  Response *_value87;
  ExceptionOr<kj::HttpInputStream::Response> *result_local;
  
  pRVar1 = readMaybe<kj::HttpInputStream::Response>(&result->value);
  if (pRVar1 != (Response *)0x0) {
    pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pRVar1 = mv<kj::HttpInputStream::Response>(pRVar1);
    pRVar1 = returnMaybeVoid<kj::HttpInputStream::Response>(pRVar1);
    HttpInputStream::Response::Response(__return_storage_ptr__,pRVar1);
    return __return_storage_ptr__;
  }
  pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }